

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QRect __thiscall QRectF::toAlignedRect(QRectF *this)

{
  long lVar1;
  QRect QVar2;
  long in_FS_OFFSET;
  int ymax;
  int ymin;
  int xmax;
  int xmin;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QRect *in_stack_ffffffffffffffa8;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qFloor<double>(3.19446147182121e-317);
  qCeil<double>(3.1944797522501e-317);
  qFloor<double>(3.19449408015383e-317);
  qCeil<double>(3.19451285464837e-317);
  QRect::QRect(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QRectF::toAlignedRect() const noexcept
{
    int xmin = qFloor(xp);
    int xmax = qCeil(xp + w);
    int ymin = qFloor(yp);
    int ymax = qCeil(yp + h);
    return QRect(xmin, ymin, xmax - xmin, ymax - ymin);
}